

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uutils.c
# Opt level: O0

LispPTR unix_username(LispPTR *args)

{
  __uid_t __uid;
  int iVar1;
  passwd *ppVar2;
  passwd *pwd;
  LispPTR *args_local;
  
  __uid = getuid();
  ppVar2 = getpwuid(__uid);
  if (ppVar2 == (passwd *)0x0) {
    args_local._4_4_ = 0;
  }
  else {
    iVar1 = c_string_to_lisp_string(ppVar2->pw_name,*args);
    if (iVar1 == 0) {
      args_local._4_4_ = 0x4c;
    }
    else {
      args_local._4_4_ = 0;
    }
  }
  return args_local._4_4_;
}

Assistant:

LispPTR unix_username(LispPTR *args) {
#ifndef DOS
  struct passwd *pwd;

  if ((pwd = getpwuid(getuid())) == NULL) return NIL;
  if (c_string_to_lisp_string(pwd->pw_name, args[0])) return NIL;
#endif /* DOS */
  return ATOM_T;
}